

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndTable(void)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  ImVec4 *pIVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  char cVar8;
  ImGuiTable *pIVar9;
  ImGuiWindow *window;
  ImGuiWindow *pIVar10;
  ImDrawListSplitter *this;
  ulong uVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  ImGuiTableTempData *pIVar16;
  char *pcVar17;
  ImGuiTableColumn *pIVar18;
  ImDrawList *draw_list;
  ImGuiTableColumn *column;
  ImGuiTable *p;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 local_38;
  
  pIVar12 = GImGui;
  pIVar9 = GImGui->CurrentTable;
  if (pIVar9 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4b3,"void ImGui::EndTable()");
  }
  if (pIVar9->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar9);
  }
  window = pIVar9->InnerWindow;
  if (window != pIVar12->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4c2,"void ImGui::EndTable()");
  }
  uVar21 = pIVar9->Flags;
  pIVar10 = pIVar9->OuterWindow;
  pIVar16 = pIVar9->TempData;
  if ((pIVar10 != window) && (pIVar10 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4c3,"void ImGui::EndTable()");
  }
  if (pIVar9->IsInsideRow == true) {
    TableEndRow(pIVar9);
  }
  if (((uVar21 & 0x20) != 0) && (pIVar9->HoveredColumnBody != -1)) {
    bVar13 = IsAnyItemHovered();
    if (!bVar13) {
      bVar13 = IsMouseReleased(1);
      if (bVar13) {
        TableOpenContextMenu((int)pIVar9->HoveredColumnBody);
      }
    }
  }
  (window->DC).PrevLineSize = pIVar16->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar16->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar16->HostBackupCursorMaxPos;
  fVar4 = pIVar9->RowPosY2;
  pfVar1 = &(window->DC).CursorPos.y;
  if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4d2,"void ImGui::EndTable()");
  }
  if (pIVar10 == window) {
    if ((uVar21 >> 0x11 & 1) == 0) {
      fVar25 = (pIVar9->OuterRect).Max.y;
      uVar20 = -(uint)(fVar4 <= fVar25);
      fVar25 = (float)(~uVar20 & (uint)fVar4 | (uint)fVar25 & uVar20);
      (pIVar9->InnerRect).Max.y = fVar25;
      (pIVar9->OuterRect).Max.y = fVar25;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar4;
  }
  fVar25 = (pIVar9->WorkRect).Max.y;
  fVar24 = (pIVar9->OuterRect).Max.y;
  uVar20 = -(uint)(fVar24 <= fVar25);
  (pIVar9->WorkRect).Max.y = (float)(~uVar20 & (uint)fVar24 | (uint)fVar25 & uVar20);
  pIVar9->LastOuterHeight = fVar24 - (pIVar9->OuterRect).Min.y;
  if (((uint)pIVar9->Flags >> 0x18 & 1) != 0) {
    fVar25 = (pIVar9->InnerWindow->DC).CursorMaxPos.x;
    cVar8 = pIVar9->RightMostEnabledColumn;
    if ((long)cVar8 != -1) {
      if ((cVar8 < '\0') ||
         (pIVar18 = (pIVar9->Columns).Data + cVar8, (pIVar9->Columns).DataEnd <= pIVar18))
      goto LAB_0015e55a;
      fVar24 = 0.0;
      if (((uint)pIVar9->Flags >> 10 & 1) != 0) {
        fVar24 = 1.0;
      }
      fVar24 = (pIVar18->WorkMaxX + pIVar9->CellPaddingX + pIVar9->OuterPaddingX) - fVar24;
      uVar20 = -(uint)(fVar24 <= fVar25);
      fVar25 = (float)(uVar20 & (uint)fVar25 | ~uVar20 & (uint)fVar24);
    }
    if (pIVar9->ResizedColumn != -1) {
      uVar20 = -(uint)(pIVar9->ResizeLockMinContentsX2 <= fVar25);
      fVar25 = (float)((uint)fVar25 & uVar20 | ~uVar20 & (uint)pIVar9->ResizeLockMinContentsX2);
    }
    (pIVar9->InnerWindow->DC).CursorMaxPos.x = fVar25;
  }
  if ((uVar21 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  draw_list = window->DrawList;
  lVar15 = (long)(draw_list->_ClipRectStack).Size;
  if (lVar15 < 1) {
    pcVar17 = "T &ImVector<ImVec4>::back() [T = ImVec4]";
    goto LAB_0015e621;
  }
  pIVar3 = (draw_list->_ClipRectStack).Data + lVar15 + -1;
  fVar25 = pIVar3->y;
  fVar24 = pIVar3->z;
  fVar23 = pIVar3->w;
  (window->ClipRect).Min.x = pIVar3->x;
  (window->ClipRect).Min.y = fVar25;
  (window->ClipRect).Max.x = fVar24;
  (window->ClipRect).Max.y = fVar23;
  if ((uVar21 & 0x780) != 0) {
    TableDrawBorders(pIVar9);
    draw_list = window->DrawList;
  }
  this = pIVar9->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,draw_list,0);
  if ((pIVar9->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar9);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  fVar25 = pIVar9->CellPaddingX + pIVar9->CellPaddingX;
  fVar24 = (float)(int)pIVar9->ColumnsEnabledCount * fVar25 +
           pIVar9->OuterPaddingX + pIVar9->OuterPaddingX +
           (float)(pIVar9->ColumnsEnabledCount + -1) *
           (pIVar9->CellSpacingX1 + pIVar9->CellSpacingX2);
  pIVar9->ColumnsAutoFitWidth = fVar24;
  iVar14 = pIVar9->ColumnsCount;
  if (0 < (long)iVar14) {
    uVar11 = pIVar9->EnabledMaskByIndex;
    lVar15 = 0x10;
    uVar19 = 0;
    do {
      if ((uVar11 >> (uVar19 & 0x3f) & 1) != 0) {
        pIVar18 = (pIVar9->Columns).Data;
        column = (ImGuiTableColumn *)((long)pIVar18 + lVar15 + -0x10);
        if ((pIVar9->Columns).DataEnd <= column) goto LAB_0015e55a;
        if ((column->Flags & 0x18U) == 8) {
          fVar23 = *(float *)((long)&pIVar18->Flags + lVar15);
        }
        else {
          fVar23 = TableGetColumnWidthAuto(pIVar9,column);
        }
        fVar24 = fVar24 + fVar23;
        pIVar9->ColumnsAutoFitWidth = fVar24;
      }
      uVar19 = uVar19 + 1;
      lVar15 = lVar15 + 0x68;
    } while ((long)iVar14 != uVar19);
  }
  if ((pIVar10 == window) || ((pIVar9->Flags & 0x1000000U) != 0)) {
    cVar8 = pIVar9->LastResizedColumn;
    if (((long)cVar8 != -1) &&
       (((pIVar9->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar9->InstanceInteracted == pIVar9->InstanceCurrent)))) {
      if ((cVar8 < '\0') ||
         (pIVar18 = (pIVar9->Columns).Data + cVar8, (pIVar9->Columns).DataEnd <= pIVar18))
      goto LAB_0015e55a;
      fVar25 = fVar25 + pIVar9->MinColumnWidth;
      fVar24 = pIVar18->MaxX;
      if ((pIVar9->InnerClipRect).Min.x <= fVar24) {
        pIVar2 = &(pIVar9->InnerClipRect).Max;
        if (fVar24 < pIVar2->x || fVar24 == pIVar2->x) goto LAB_0015e19f;
        fVar25 = fVar25 + (fVar24 - (window->Pos).x);
      }
      else {
        fVar25 = (fVar24 - (window->Pos).x) - fVar25;
      }
      SetScrollFromPosX(window,fVar25,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_0015e19f:
  cVar8 = pIVar9->ResizedColumn;
  if (((long)cVar8 != -1) && (pIVar9->InstanceCurrent == pIVar9->InstanceInteracted)) {
    if ((cVar8 < '\0') ||
       (pIVar18 = (pIVar9->Columns).Data + cVar8, (pIVar9->Columns).DataEnd <= pIVar18)) {
LAB_0015e55a:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                    ,0x23b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pIVar9->ResizedColumnNextWidth =
         (float)(int)((((((pIVar12->IO).MousePos.x - (pIVar12->ActiveIdClickOffset).x) + 4.0) -
                       pIVar18->MinX) - pIVar9->CellSpacingX1) -
                     (pIVar9->CellPaddingX + pIVar9->CellPaddingX));
  }
  lVar15 = (long)(window->IDStack).Size;
  if (lVar15 < 1) {
    pcVar17 = "T &ImVector<unsigned int>::back() [T = unsigned int]";
LAB_0015e621:
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x695,pcVar17);
  }
  if ((window->IDStack).Data[lVar15 + -1] != (int)pIVar9->InstanceCurrent + pIVar9->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x52c,"void ImGui::EndTable()");
  }
  if ((pIVar10->DC).ItemWidthStack.Size < pIVar16->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x52d,"void ImGui::EndTable()");
  }
  PopID();
  fVar25 = (pIVar10->DC).CursorMaxPos.x;
  fVar24 = (pIVar10->DC).CursorMaxPos.y;
  IVar6 = (pIVar16->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar16->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar6;
  IVar6 = (pIVar16->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar16->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar6;
  window->SkipItems = pIVar9->HostSkipItems;
  (pIVar10->DC).CursorPos = (pIVar9->OuterRect).Min;
  (pIVar10->DC).ItemWidth = pIVar16->HostBackupItemWidth;
  (pIVar10->DC).ItemWidthStack.Size = pIVar16->HostBackupItemWidthStackSize;
  (pIVar10->DC).ColumnsOffset.x = (pIVar16->HostBackupColumnsOffset).x;
  if (pIVar10 == window) {
    IVar6 = (pIVar9->OuterRect).Min;
    IVar7 = (pIVar9->OuterRect).Max;
    local_38.x = IVar7.x - IVar6.x;
    local_38.y = IVar7.y - IVar6.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar9->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  uVar21 = pIVar9->Flags;
  if ((uVar21 >> 0x10 & 1) == 0) {
    fVar23 = (pIVar16->UserOuterSize).x;
    fVar22 = 0.0;
    if (fVar23 <= 0.0) {
      if ((uVar21 >> 0x18 & 1) != 0) {
        fVar22 = (window->ScrollbarSizes).x;
      }
      fVar26 = (pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth;
      fVar5 = (pIVar10->DC).IdealMaxPos.x;
      fVar23 = (fVar22 + fVar26) - fVar23;
      uVar20 = -(uint)(fVar23 <= fVar5);
      (pIVar10->DC).IdealMaxPos.x = (float)(uVar20 & (uint)fVar5 | ~uVar20 & (uint)fVar23);
      fVar23 = (pIVar9->OuterRect).Max.x;
      if (fVar26 <= fVar23) {
        fVar23 = fVar26;
      }
    }
    else {
      fVar23 = (pIVar9->OuterRect).Max.x;
    }
  }
  else {
    if ((uVar21 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x54c,"void ImGui::EndTable()");
    }
    fVar23 = (pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth;
  }
  uVar20 = -(uint)(fVar23 <= fVar25);
  (pIVar10->DC).CursorMaxPos.x = (float)(~uVar20 & (uint)fVar23 | (uint)fVar25 & uVar20);
  fVar25 = (pIVar16->UserOuterSize).y;
  fVar23 = 0.0;
  if (fVar25 <= 0.0) {
    if ((uVar21 >> 0x19 & 1) != 0) {
      fVar23 = (window->ScrollbarSizes).y;
    }
    fVar22 = (pIVar10->DC).IdealMaxPos.y;
    fVar25 = (fVar23 + fVar4) - fVar25;
    uVar21 = -(uint)(fVar25 <= fVar22);
    (pIVar10->DC).IdealMaxPos.y = (float)(uVar21 & (uint)fVar22 | ~uVar21 & (uint)fVar25);
    fVar25 = (pIVar9->OuterRect).Max.y;
    if (fVar4 <= fVar25) {
      fVar25 = fVar4;
    }
  }
  else {
    fVar25 = (pIVar9->OuterRect).Max.y;
  }
  uVar21 = -(uint)(fVar25 <= fVar24);
  (pIVar10->DC).CursorMaxPos.y = (float)(~uVar21 & (uint)fVar25 | (uint)fVar24 & uVar21);
  if (pIVar9->IsSettingsDirty == true) {
    TableSaveSettings(pIVar9);
  }
  pIVar9->IsInitializing = false;
  if ((pIVar12->CurrentWindow != pIVar10) || (pIVar12->CurrentTable != pIVar9)) {
    __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x56b,"void ImGui::EndTable()");
  }
  iVar14 = pIVar12->CurrentTableStackIdx;
  if (iVar14 < 0) {
    __assert_fail("g.CurrentTableStackIdx >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x56c,"void ImGui::EndTable()");
  }
  pIVar12->CurrentTableStackIdx = iVar14 - 1U;
  if (iVar14 == 0) {
LAB_0015e534:
    pIVar12->CurrentTable = (ImGuiTable *)0x0;
  }
  else {
    if ((pIVar12->TablesTempDataStack).Size < iVar14) {
      pcVar17 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
LAB_0015e6f2:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,pcVar17);
    }
    pIVar16 = (pIVar12->TablesTempDataStack).Data;
    if (pIVar16 == (ImGuiTableTempData *)0x0) goto LAB_0015e534;
    pIVar16 = pIVar16 + (iVar14 - 1U);
    iVar14 = pIVar16->TableIndex;
    if (((long)iVar14 < 0) || ((pIVar12->Tables).Buf.Size <= iVar14)) {
      pcVar17 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
      goto LAB_0015e6f2;
    }
    pIVar9 = (pIVar12->Tables).Buf.Data;
    p = pIVar9 + iVar14;
    pIVar12->CurrentTable = p;
    if (pIVar9 != (ImGuiTable *)0x0) {
      p->TempData = pIVar16;
      p->DrawSplitter = &pIVar16->DrawSplitter;
      iVar14 = ImPool<ImGuiTable>::GetIndex(&pIVar12->Tables,p);
      goto LAB_0015e544;
    }
  }
  iVar14 = -1;
LAB_0015e544:
  (pIVar10->DC).CurrentTableIdx = iVar14;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.CurrentTableStackIdx >= 0);
    g.CurrentTableStackIdx--;
    temp_data = g.CurrentTableStackIdx >= 0 ? &g.TablesTempDataStack[g.CurrentTableStackIdx] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}